

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

int __thiscall ncnn::ParamDict::load_param_bin(ParamDict *this,DataReader *dr)

{
  uint uVar1;
  undefined8 in_RAX;
  char *__format;
  int id;
  int len;
  
  len = (int)((ulong)in_RAX >> 0x20);
  clear(this);
  _id = (ulong)(uint)len << 0x20;
  uVar1 = (*dr->_vptr_DataReader[3])(dr,&id,4);
  if (uVar1 == 4) {
    do {
      if ((long)id == -0xe9) {
        return 0;
      }
      if (id < -0x5b03) {
        _id = (ulong)(-id - 0x5b04);
        uVar1 = (*dr->_vptr_DataReader[3])(dr,&len,4);
        if (uVar1 != 4) {
          __format = "ParamDict read array length failed %d\n";
          goto LAB_001212f0;
        }
        Mat::create(&this->params[id].v,len,4,(Allocator *)0x0);
        uVar1 = (*dr->_vptr_DataReader[3])(dr,this->params[id].v.data,(ulong)(uint)(len << 2));
        if (uVar1 != len << 2) {
          __format = "ParamDict read array element failed %d\n";
          goto LAB_001212f0;
        }
        this->params[id].type = 4;
      }
      else {
        uVar1 = (*dr->_vptr_DataReader[3])(dr,&this->params[id].field_1,4);
        if (uVar1 != 4) {
          __format = "ParamDict read value failed %d\n";
          goto LAB_001212f0;
        }
        this->params[id].type = 1;
      }
      uVar1 = (*dr->_vptr_DataReader[3])(dr,&id,4);
    } while (uVar1 == 4);
    __format = "ParamDict read EOP failed %d\n";
  }
  else {
    __format = "ParamDict read id failed %d\n";
  }
LAB_001212f0:
  fprintf(_stderr,__format,(ulong)uVar1);
  return -1;
}

Assistant:

int ParamDict::load_param_bin(const DataReader& dr)
{
    clear();

//     binary 0
//     binary 100
//     binary 1
//     binary 1.250000
//     binary 3 | array_bit
//     binary 5
//     binary 0.1
//     binary 0.2
//     binary 0.4
//     binary 0.8
//     binary 1.0
//     binary -233(EOP)

    int id = 0;
    int nread;
    nread = dr.read(&id, sizeof(int));
    if (nread != (int)sizeof(int))
    {
        fprintf(stderr, "ParamDict read id failed %d\n", nread);
        return -1;
    }

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            nread = dr.read(&len, sizeof(int));
            if (nread != (int)sizeof(int))
            {
                fprintf(stderr, "ParamDict read array length failed %d\n", nread);
                return -1;
            }

            params[id].v.create(len);

            float* ptr = params[id].v;
            nread = dr.read(ptr, sizeof(float) * len);
            if (nread != (int)sizeof(float) * len)
            {
                fprintf(stderr, "ParamDict read array element failed %d\n", nread);
                return -1;
            }

            params[id].type = 4;
        }
        else
        {
            nread = dr.read(&params[id].f, sizeof(float));
            if (nread != (int)sizeof(float))
            {
                fprintf(stderr, "ParamDict read value failed %d\n", nread);
                return -1;
            }

            params[id].type = 1;
        }

        nread = dr.read(&id, sizeof(int));
        if (nread != (int)sizeof(int))
        {
            fprintf(stderr, "ParamDict read EOP failed %d\n", nread);
            return -1;
        }
    }

    return 0;
}